

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void runpush(runcxdef *ctx,dattyp typ,runsdef *val)

{
  ushort uVar1;
  runsdef *prVar2;
  anon_union_8_4_1dda36f5_for_runsv aVar3;
  undefined7 uVar4;
  
  prVar2 = ctx->runcxsp;
  uVar4 = *(undefined7 *)&val->field_0x1;
  aVar3 = val->runsv;
  prVar2->runstyp = val->runstyp;
  *(undefined7 *)&prVar2->field_0x1 = uVar4;
  prVar2->runsv = aVar3;
  ctx->runcxsp->runstyp = (uchar)typ;
  if ((typ & 0xfffffffbU) == 3) {
    uVar1 = *(ushort *)(val->runsv).runsvstr;
    if ((uint)(*(int *)&ctx->runcxhtop - *(int *)&ctx->runcxhp) <= (uint)uVar1) {
      runhcmp(ctx,(uint)uVar1,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
    }
    memcpy(ctx->runcxhp,(val->runsv).runsvstr,(ulong)uVar1);
    ctx->runcxsp->runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->runcxhp;
    ctx->runcxhp = ctx->runcxhp + uVar1;
  }
  ctx->runcxsp = ctx->runcxsp + 1;
  return;
}

Assistant:

void runpush(runcxdef *ctx, dattyp typ, runsdef *val)
{
    int len;

    /* check for stack overflow */
    runstkovf(ctx);
    
    OSCPYSTRUCT(*(ctx->runcxsp), *val);
    ctx->runcxsp->runstyp = typ;

    /* variable-length data must be copied into the heap */
    if (typ == DAT_SSTRING || typ == DAT_LIST)
    {
        len = osrp2(val->runsv.runsvstr);
        runhres(ctx, len, 0);                      /* reserve space in heap */
        memcpy(ctx->runcxhp, val->runsv.runsvstr, (size_t)len);
        ctx->runcxsp->runsv.runsvstr = ctx->runcxhp;
        ctx->runcxhp += len;
    }
    
    /* increment stack pointer */
    ++(ctx->runcxsp);
}